

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManPrintBoxInfo(Au_Ntk_t *pNtk)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Au_Man_t *pAVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint *__ptr;
  void *pvVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  pAVar4 = pNtk->pMan;
  if (pAVar4 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    return;
  }
  uVar2 = (pAVar4->vNtks).nSize;
  __ptr = (uint *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar9 = uVar2;
  }
  __ptr[1] = 0;
  *__ptr = uVar9;
  if (uVar9 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar9 << 2);
  }
  *(void **)(__ptr + 2) = pvVar7;
  __ptr[1] = uVar2;
  if (pvVar7 != (void *)0x0) {
    memset(pvVar7,0,(long)(int)uVar2 << 2);
  }
  if (1 < (pAVar4->vNtks).nSize) {
    lVar13 = 1;
    do {
      puVar5 = (undefined8 *)(pAVar4->vNtks).pArray[lVar13];
      if (*(int *)(puVar5 + 0xc) != 0) {
        uVar2 = __ptr[1];
        if ((int)*__ptr < (int)uVar2) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc((long)(int)uVar2 << 2);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),(long)(int)uVar2 << 2);
          }
          *(void **)(__ptr + 2) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr = uVar2;
        }
        if (0 < (int)uVar2) {
          memset(*(void **)(__ptr + 2),0,(ulong)uVar2 * 4);
        }
        if (0 < *(int *)((long)puVar5 + 0x3c)) {
          lVar8 = 0;
          do {
            if (*(int *)((long)puVar5 + 0x3c) <= lVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar9 = *(uint *)(puVar5[8] + lVar8 * 4);
            lVar12 = *(long *)(puVar5[0xf] + (long)((int)uVar9 >> 0xc) * 8);
            uVar10 = (ulong)((uVar9 & 0xfff) << 4);
            uVar11 = *(ulong *)(lVar12 + uVar10);
            if ((uVar11 & 0x700000000) == 0x600000000) {
              lVar12 = *(long *)(*(long *)(lVar12 + uVar10 & 0xfffffffffffffc00) + 8);
              uVar9 = (uint)uVar11;
              if (*(int *)(lVar12 + 0xc) <= (int)(uVar9 & 0x3fffffff)) goto LAB_00850833;
              puVar6 = *(undefined8 **)(*(long *)(lVar12 + 0x10) + (ulong)(uVar9 & 0x3fffffff) * 8);
              if ((puVar6 != (undefined8 *)0x0) && (puVar6 != puVar5)) {
                iVar3 = (pAVar4->vNtks).nSize;
                uVar9 = 0xffffffff;
                if (0 < (long)iVar3) {
                  lVar12 = 0;
                  do {
                    if ((undefined8 *)(pAVar4->vNtks).pArray[lVar12] == puVar6) {
                      uVar9 = (uint)lVar12;
                      break;
                    }
                    lVar12 = lVar12 + 1;
                  } while (iVar3 != lVar12);
                }
                if (((int)uVar9 < 0) || (iVar3 <= (int)uVar9)) {
                  __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                ,0x24c,"void Au_ManPrintBoxInfo(Au_Ntk_t *)");
                }
                if ((int)uVar2 <= (int)uVar9) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                piVar1 = (int *)(*(long *)(__ptr + 2) + (ulong)uVar9 * 4);
                *piVar1 = *piVar1 + 1;
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)puVar5 + 0x3c));
        }
        printf("MODULE  ");
        printf("%-30s : ",*puVar5);
        printf("PI=%6d ",(ulong)*(uint *)(puVar5 + 10));
        printf("PO=%6d ",(ulong)*(uint *)((long)puVar5 + 0x54));
        printf("BB=%6d ",(ulong)*(uint *)(puVar5 + 0xc));
        printf("ND=%6d ");
        putchar(10);
        if (0 < (int)uVar2) {
          lVar8 = *(long *)(__ptr + 2);
          uVar11 = 0;
          do {
            uVar9 = *(uint *)(lVar8 + uVar11 * 4);
            if (uVar9 != 0) {
              if ((long)(pAVar4->vNtks).nSize <= (long)uVar11) {
LAB_00850833:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              printf("%15d : %s\n",(ulong)uVar9,*(pAVar4->vNtks).pArray[uVar11]);
            }
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pAVar4->vNtks).nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (1 < (pAVar4->vNtks).nSize) {
    lVar13 = 1;
    do {
      puVar5 = (undefined8 *)(pAVar4->vNtks).pArray[lVar13];
      if (*(int *)(puVar5 + 0xc) == 0) {
        printf("MODULE  ");
        printf("%-30s : ",*puVar5);
        printf("PI=%6d ",(ulong)*(uint *)(puVar5 + 10));
        printf("PO=%6d ",(ulong)*(uint *)((long)puVar5 + 0x54));
        printf("BB=%6d ",(ulong)*(uint *)(puVar5 + 0xc));
        printf("ND=%6d ",(ulong)*(uint *)((long)puVar5 + 100));
        putchar(10);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pAVar4->vNtks).nSize);
  }
  return;
}

Assistant:

void Au_ManPrintBoxInfo( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel, * pBoxModel;
    Au_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

/*
    vMods->nSize--;
    vMods->pArray++;
    // sort models by name
    Vec_PtrSort( vMods, (int(*)())Au_NtkCompareNames );
    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Au_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Au_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );
    vMods->pArray--;
    vMods->nSize++;
*/

//    Vec_PtrForEachEntry( Au_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Au_NtkName(pModel) );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Au_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = Au_ObjModel(pObj);
            if ( pBoxModel == NULL || pBoxModel == pModel )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Au_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) ); // sans constants
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Au_NtkName((Au_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );
    }
}